

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_entityValueTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  byte *pbVar2;
  int local_4c;
  int tok;
  char *start;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if (ptr < end) {
    end_local = ptr;
    if ((long)end - (long)ptr < 1) {
      enc_local._4_4_ = -1;
    }
    else {
      while (0 < (long)end - (long)end_local) {
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
        case 3:
          if (end_local == ptr) {
            iVar1 = normal_scanRef(enc,end_local + 1,end,nextTokPtr);
            return iVar1;
          }
          *nextTokPtr = end_local;
          return 6;
        default:
          end_local = end_local + 1;
          break;
        case 5:
          end_local = end_local + 2;
          break;
        case 6:
          end_local = end_local + 3;
          break;
        case 7:
          end_local = end_local + 4;
          break;
        case 9:
          if (end_local != ptr) {
            *nextTokPtr = end_local;
            return 6;
          }
          pbVar2 = (byte *)(end_local + 1);
          if ((long)end - (long)pbVar2 < 1) {
            return -3;
          }
          if (*(char *)((long)enc[1].scanners + (ulong)*pbVar2) == '\n') {
            pbVar2 = (byte *)(end_local + 2);
          }
          end_local = (char *)pbVar2;
          *nextTokPtr = end_local;
          return 7;
        case 10:
          if (end_local == ptr) {
            *nextTokPtr = end_local + 1;
            return 7;
          }
          *nextTokPtr = end_local;
          return 6;
        case 0x1e:
          if (end_local == ptr) {
            local_4c = normal_scanPercent(enc,end_local + 1,end,nextTokPtr);
            if (local_4c == 0x16) {
              local_4c = 0;
            }
            return local_4c;
          }
          *nextTokPtr = end_local;
          return 6;
        }
      }
      *nextTokPtr = end_local;
      enc_local._4_4_ = 6;
    }
  }
  else {
    enc_local._4_4_ = -4;
  }
  return enc_local._4_4_;
}

Assistant:

static int PTRCALL
PREFIX(entityValueTok)(const ENCODING *enc, const char *ptr,
                       const char *end, const char **nextTokPtr)
{
  const char *start;
  if (ptr >= end)
    return XML_TOK_NONE;
  else if (! HAS_CHAR(enc, ptr, end))
    return XML_TOK_PARTIAL;
  start = ptr;
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: ptr += n; break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_AMP:
      if (ptr == start)
        return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_PERCNT:
      if (ptr == start) {
        int tok =  PREFIX(scanPercent)(enc, ptr + MINBPC(enc),
                                       end, nextTokPtr);
        return (tok == XML_TOK_PERCENT) ? XML_TOK_INVALID : tok;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_LF:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_CR:
      if (ptr == start) {
        ptr += MINBPC(enc);
        if (! HAS_CHAR(enc, ptr, end))
          return XML_TOK_TRAILING_CR;
        if (BYTE_TYPE(enc, ptr) == BT_LF)
          ptr += MINBPC(enc);
        *nextTokPtr = ptr;
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}